

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer-test.cc
# Opt level: O0

void __thiscall
ExprWriterTest_IfExprPrecedence_Test::~ExprWriterTest_IfExprPrecedence_Test
          (ExprWriterTest_IfExprPrecedence_Test *this)

{
  ExprWriterTest_IfExprPrecedence_Test *in_stack_00000010;
  
  ~ExprWriterTest_IfExprPrecedence_Test(in_stack_00000010);
  return;
}

Assistant:

TEST_F(ExprWriterTest, IfExprPrecedence) {
  NumericExpr n0 = MakeConst(0), n1 = MakeConst(1), n2 = MakeConst(2);
  LogicalExpr e = MakeBinaryLogical(ex::OR, l0, l1);
  CHECK_WRITE("if 0 || 1 then if 0 || 1 then 1",
      MakeIf(e, MakeIf(e, n1, n0), n0));
  CHECK_WRITE("if 0 || 1 then if 0 || 1 then 1 else 2",
      MakeIf(e, MakeIf(e, n1, n2), n0));
  CHECK_WRITE("if 0 || 1 then (if 0 || 1 then 1) else 2",
      MakeIf(e, MakeIf(e, n1, n0), n2));
  CHECK_WRITE("if 0 || 1 then 0 else if 0 || 1 then 1 else 2",
      MakeIf(e, n0, MakeIf(e, n1, n2)));
  CHECK_WRITE("if !(0 || 1) then x1 + 1",
      MakeIf(MakeNot(e), MakeBinary(ex::ADD, MakeVariable(0), n1), n0));
}